

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_191867c::looksLikeSpecialVariable
          (anon_unknown_dwarf_191867c *this,string *var,static_string_view prefix,size_t varNameLen)

{
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  char *pcVar4;
  bool local_85;
  char local_71;
  string local_70;
  string_view local_50;
  string_view local_40;
  char *local_30;
  size_t varNameLen_local;
  string *var_local;
  static_string_view prefix_local;
  
  local_30 = prefix.super_string_view._M_str;
  prefix_local.super_string_view._M_len = prefix.super_string_view._M_len;
  varNameLen_local = (size_t)this;
  var_local = var;
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&var_local);
  bVar1 = false;
  local_85 = false;
  if ((char *)(sVar3 + 3) <= local_30) {
    local_40 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)varNameLen_local);
    local_71 = '{';
    cmStrCat<cm::static_string_view&,char>(&local_70,(static_string_view *)&var_local,&local_71);
    bVar1 = true;
    local_50 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_70);
    bVar2 = cmHasPrefix(local_40,local_50);
    local_85 = false;
    if (bVar2) {
      pcVar4 = (char *)std::__cxx11::string::operator[](varNameLen_local);
      local_85 = *pcVar4 == '}';
    }
  }
  prefix_local.super_string_view._M_str._7_1_ = local_85;
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_70);
  }
  return (bool)(prefix_local.super_string_view._M_str._7_1_ & 1);
}

Assistant:

bool looksLikeSpecialVariable(const std::string& var,
                              cm::static_string_view prefix,
                              const std::size_t varNameLen)
{
  // NOTE Expecting a variable name at least 1 char length:
  // <prefix> + `{` + <varname> + `}`
  return ((prefix.size() + 3) <= varNameLen) &&
    cmHasPrefix(var, cmStrCat(prefix, '{')) && var[varNameLen - 1] == '}';
}